

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

MovInst __thiscall mocker::detail::MoveInfo::popWorklist(MoveInfo *this)

{
  long lVar1;
  size_type sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  MovInst MVar3;
  
  lVar1 = *(long *)(in_RSI + 0xf0);
  (this->active)._M_h._M_buckets = *(__buckets_ptr *)(lVar1 + 8);
  sVar2 = *(size_type *)(lVar1 + 0x10);
  (this->active)._M_h._M_bucket_count = sVar2;
  if (sVar2 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
    }
  }
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::erase((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)(in_RSI + 0xe0),
          (const_iterator)
          ((_Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true> *)(in_RSI + 0xf0))->_M_cur
         );
  MVar3.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MovInst)MVar3.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MovInst MoveInfo::popWorklist() {
  auto res = *worklist.begin();
  worklist.erase(worklist.begin());
  return res;
}